

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

int nni_dialer_find(nni_dialer **dp,uint32_t id)

{
  int iVar1;
  nni_dialer *pnVar2;
  nni_dialer *d;
  uint32_t id_local;
  nni_dialer **dp_local;
  
  nni_mtx_lock(&dialers_lk);
  pnVar2 = (nni_dialer *)nni_id_get(&dialers,(ulong)id);
  if (pnVar2 != (nni_dialer *)0x0) {
    pnVar2->d_ref = pnVar2->d_ref + 1;
    *dp = pnVar2;
  }
  nni_mtx_unlock(&dialers_lk);
  iVar1 = 0;
  if (pnVar2 == (nni_dialer *)0x0) {
    iVar1 = 0xc;
  }
  return iVar1;
}

Assistant:

int
nni_dialer_find(nni_dialer **dp, uint32_t id)
{
	nni_dialer *d;

	nni_mtx_lock(&dialers_lk);
	if ((d = nni_id_get(&dialers, id)) != NULL) {
		d->d_ref++;
		*dp = d;
	}
	nni_mtx_unlock(&dialers_lk);
	return (d == NULL ? NNG_ENOENT : 0);
}